

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_sxnet.c
# Opt level: O0

ASN1_OCTET_STRING * SXNET_get_id_ulong(SXNET *sx,ulong lzone)

{
  int iVar1;
  ASN1_INTEGER *a;
  ASN1_OCTET_STRING *pAVar2;
  ASN1_OCTET_STRING *oct;
  ASN1_INTEGER *izone;
  
  a = ASN1_INTEGER_new();
  if ((a != (ASN1_INTEGER *)0x0) && (iVar1 = ASN1_INTEGER_set(a,lzone), iVar1 != 0)) {
    pAVar2 = SXNET_get_id_INTEGER(sx,a);
    ASN1_INTEGER_free(a);
    return pAVar2;
  }
  iVar1 = (int)(lzone >> 0x20);
  ERR_new();
  ERR_set_debug((char *)sx,iVar1,(char *)a);
  ERR_set_error(0x22,0xc0100,(char *)0x0);
  ASN1_INTEGER_free(a);
  return (ASN1_OCTET_STRING *)0x0;
}

Assistant:

ASN1_OCTET_STRING *SXNET_get_id_ulong(SXNET *sx, unsigned long lzone)
{
    ASN1_INTEGER *izone;
    ASN1_OCTET_STRING *oct;

    if ((izone = ASN1_INTEGER_new()) == NULL
        || !ASN1_INTEGER_set(izone, lzone)) {
        ERR_raise(ERR_LIB_X509V3, ERR_R_MALLOC_FAILURE);
        ASN1_INTEGER_free(izone);
        return NULL;
    }
    oct = SXNET_get_id_INTEGER(sx, izone);
    ASN1_INTEGER_free(izone);
    return oct;
}